

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_bin_ugrid_cell
          (REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_GLOB nnode,FILE *file,
          REF_FILEPOS conn_offset,REF_FILEPOS faceid_offset,REF_BOOL swap_endian,
          REF_BOOL sixty_four_bit)

{
  uint uVar1;
  clock_t cVar2;
  int local_1e8;
  int local_198;
  int local_148;
  int local_128;
  uint local_11c;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INT total_add;
  REF_INT total_mpi;
  REF_INT total;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  clock_t add_toc;
  clock_t mpi_toc;
  clock_t read_toc;
  clock_t tic;
  REF_INT new_location;
  REF_INT ncell_keep;
  REF_INT node;
  REF_INT part;
  REF_INT cell;
  REF_INT section_size;
  REF_INT size_per;
  REF_INT node_per;
  REF_INT *start_to_send;
  REF_INT *elements_to_send;
  REF_INT *sent_part;
  REF_INT *dest;
  REF_GLOB *sent_c2n;
  REF_GLOB *c2n;
  int local_60;
  REF_INT elements_to_receive;
  REF_INT end_of_message;
  REF_INT chunk;
  REF_LONG ncell_read;
  REF_MPI ref_mpi;
  REF_FILEPOS conn_offset_local;
  FILE *file_local;
  REF_GLOB nnode_local;
  REF_NODE ref_node_local;
  REF_LONG ncell_local;
  REF_CELL ref_cell_local;
  
  ncell_read = (REF_LONG)ref_node->ref_mpi;
  local_60 = -1;
  mpi_toc = 0;
  add_toc = 0;
  _ref_private_macro_code_rss_1 = 0;
  if ((int)(ncell / (long)((REF_MPI)ncell_read)->n) < 1000000) {
    local_11c = 1000000;
  }
  else {
    local_11c = (uint)(ncell / (long)((REF_MPI)ncell_read)->n);
  }
  elements_to_receive = local_11c;
  ref_mpi = (REF_MPI)conn_offset;
  conn_offset_local = (REF_FILEPOS)file;
  file_local = (FILE *)nnode;
  nnode_local = (REF_GLOB)ref_node;
  ref_node_local = (REF_NODE)ncell;
  ncell_local = (REF_LONG)ref_cell;
  if ((1 < ((REF_MPI)ncell_read)->timing) && (((REF_MPI)ncell_read)->id == 0)) {
    printf("chunk %d ncell %ld nproc %d\n",(ulong)local_11c,ncell,
           (ulong)(uint)((REF_MPI)ncell_read)->n);
  }
  cell = *(int *)(ncell_local + 8);
  section_size = *(REF_INT *)(ncell_local + 0xc);
  if (cell * elements_to_receive < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x49c,
           "ref_part_bin_ugrid_cell","malloc sent_c2n of REF_GLOB negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    dest = (REF_INT *)malloc((long)(cell * elements_to_receive) << 3);
    if (dest == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x49c,
             "ref_part_bin_ugrid_cell","malloc sent_c2n of REF_GLOB NULL");
      ref_cell_local._4_4_ = 2;
    }
    else {
      if (*(int *)(ncell_read + 4) == 0) {
        if (*(int *)ncell_read < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x49f,"ref_part_bin_ugrid_cell","malloc elements_to_send of REF_INT negative");
          return 1;
        }
        start_to_send = (REF_INT *)malloc((long)*(int *)ncell_read << 2);
        if (start_to_send == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x49f,"ref_part_bin_ugrid_cell","malloc elements_to_send of REF_INT NULL");
          return 2;
        }
        if (*(int *)ncell_read < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a0,"ref_part_bin_ugrid_cell","malloc start_to_send of REF_INT negative");
          return 1;
        }
        _size_per = (undefined4 *)malloc((long)*(int *)ncell_read << 2);
        if (_size_per == (undefined4 *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a0,"ref_part_bin_ugrid_cell","malloc start_to_send of REF_INT NULL");
          return 2;
        }
        if (cell * elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a1,"ref_part_bin_ugrid_cell","malloc c2n of REF_GLOB negative");
          return 1;
        }
        sent_c2n = (REF_GLOB *)malloc((long)(cell * elements_to_receive) << 3);
        if (sent_c2n == (REF_GLOB *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a1,"ref_part_bin_ugrid_cell","malloc c2n of REF_GLOB NULL");
          return 2;
        }
        if (elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a2,"ref_part_bin_ugrid_cell","malloc dest of REF_INT negative");
          return 1;
        }
        sent_part = (REF_INT *)malloc((long)elements_to_receive << 2);
        if (sent_part == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x4a2,"ref_part_bin_ugrid_cell","malloc dest of REF_INT NULL");
          return 2;
        }
        _end_of_message = 0;
        while (_end_of_message < (long)ref_node_local) {
          if ((long)elements_to_receive < (long)ref_node_local - _end_of_message) {
            local_128 = elements_to_receive;
          }
          else {
            local_128 = (int)ref_node_local - (int)_end_of_message;
          }
          part = local_128;
          read_toc = clock();
          ref_private_macro_code_rss_2 =
               ref_part_bin_ugrid_pack_cell
                         ((FILE *)conn_offset_local,swap_endian,sixty_four_bit,(REF_FILEPOS)ref_mpi,
                          faceid_offset,part,_end_of_message,section_size,cell,sent_c2n);
          if (ref_private_macro_code_rss_2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x4ac,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_private_macro_code_rss_2,
                   "read c2n");
            return ref_private_macro_code_rss_2;
          }
          cVar2 = clock();
          mpi_toc = (cVar2 - read_toc) + mpi_toc;
          _end_of_message = part + _end_of_message;
          for (node = 0; node < part; node = node + 1) {
            if (sent_c2n[cell * node] /
                (((long)file_local + (long)*(int *)ncell_read + -1) / (long)*(int *)ncell_read) <
                (long)file_local -
                (long)*(int *)ncell_read *
                ((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read)) {
              local_148 = (int)(sent_c2n[cell * node] /
                               (((long)file_local + (long)*(int *)ncell_read + -1) /
                               (long)*(int *)ncell_read));
            }
            else {
              local_148 = (int)((sent_c2n[cell * node] -
                                ((long)file_local -
                                (long)*(int *)ncell_read *
                                ((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read))
                                * (((long)file_local + (long)*(int *)ncell_read + -1) /
                                  (long)*(int *)ncell_read)) /
                               ((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read))
                          + ((int)file_local -
                            *(int *)ncell_read *
                            (int)((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read)
                            );
            }
            sent_part[node] = local_148;
          }
          for (ncell_keep = 0; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            start_to_send[ncell_keep] = 0;
          }
          for (node = 0; node < part; node = node + 1) {
            start_to_send[sent_part[node]] = start_to_send[sent_part[node]] + 1;
          }
          *_size_per = 0;
          for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            _size_per[ncell_keep] = _size_per[ncell_keep + -1] + start_to_send[ncell_keep + -1];
          }
          for (ncell_keep = 0; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            start_to_send[ncell_keep] = 0;
          }
          for (node = 0; node < part; node = node + 1) {
            tic._0_4_ = _size_per[sent_part[node]] + start_to_send[sent_part[node]];
            for (new_location = 0; new_location < cell; new_location = new_location + 1) {
              *(REF_GLOB *)(dest + (long)(new_location + cell * (int)tic) * 2) =
                   sent_c2n[new_location + cell * node];
            }
            start_to_send[sent_part[node]] = start_to_send[sent_part[node]] + 1;
          }
          read_toc = clock();
          for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            if (0 < start_to_send[ncell_keep]) {
              ref_malloc_init_i =
                   ref_mpi_scatter_send
                             ((REF_MPI)ncell_read,start_to_send + ncell_keep,1,1,ncell_keep);
              if (ref_malloc_init_i != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x4cb,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_malloc_init_i,"send");
                return ref_malloc_init_i;
              }
              ref_private_macro_code_rss_3 =
                   ref_mpi_scatter_send
                             ((REF_MPI)ncell_read,dest + (long)(cell * _size_per[ncell_keep]) * 2,
                              cell * start_to_send[ncell_keep],2,ncell_keep);
              if (ref_private_macro_code_rss_3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x4cf,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_private_macro_code_rss_3,
                       "send");
                return ref_private_macro_code_rss_3;
              }
              ref_private_macro_code_rss_3 = 0;
            }
          }
          cVar2 = clock();
          add_toc = (cVar2 - read_toc) + add_toc;
          read_toc = clock();
          tic._4_4_ = *start_to_send;
          if (0 < tic._4_4_) {
            if (cell * tic._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x4d8,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT negative");
              return 1;
            }
            elements_to_send = (REF_INT *)malloc((long)(cell * tic._4_4_) << 2);
            if (elements_to_send == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x4d8,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_4 = 0; ref_private_macro_code_rss_4 < cell * tic._4_4_;
                ref_private_macro_code_rss_4 = ref_private_macro_code_rss_4 + 1) {
              elements_to_send[ref_private_macro_code_rss_4] = -1;
            }
            for (node = 0; node < tic._4_4_; node = node + 1) {
              for (new_location = 0; new_location < section_size; new_location = new_location + 1) {
                if (*(long *)(dest + (long)(new_location + cell * node) * 2) /
                    (((long)file_local + (long)*(int *)ncell_read + -1) / (long)*(int *)ncell_read)
                    < (long)file_local -
                      (long)*(int *)ncell_read *
                      ((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read)) {
                  local_198 = (int)(*(long *)(dest + (long)(new_location + cell * node) * 2) /
                                   (((long)file_local + (long)*(int *)ncell_read + -1) /
                                   (long)*(int *)ncell_read));
                }
                else {
                  local_198 = (int)((*(long *)(dest + (long)(new_location + cell * node) * 2) -
                                    ((long)file_local -
                                    (long)*(int *)ncell_read *
                                    ((long)(file_local[-1]._unused2 + 0x13) /
                                    (long)*(int *)ncell_read)) *
                                    (((long)file_local + (long)*(int *)ncell_read + -1) /
                                    (long)*(int *)ncell_read)) /
                                   ((long)(file_local[-1]._unused2 + 0x13) /
                                   (long)*(int *)ncell_read)) +
                              ((int)file_local -
                              *(int *)ncell_read *
                              (int)((long)(file_local[-1]._unused2 + 0x13) /
                                   (long)*(int *)ncell_read));
                }
                elements_to_send[new_location + cell * node] = local_198;
              }
            }
            ref_private_macro_code_rss_5 =
                 ref_cell_add_many_global
                           ((REF_CELL)ncell_local,(REF_NODE)nnode_local,tic._4_4_,(REF_GLOB *)dest,
                            elements_to_send,*(REF_INT *)(ncell_read + 4));
            if (ref_private_macro_code_rss_5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x4e1,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_private_macro_code_rss_5,
                     "glob");
              return ref_private_macro_code_rss_5;
            }
            if (elements_to_send != (REF_INT *)0x0) {
              free(elements_to_send);
            }
          }
          cVar2 = clock();
          _ref_private_macro_code_rss_1 = (cVar2 - read_toc) + _ref_private_macro_code_rss_1;
        }
        if (sent_part != (REF_INT *)0x0) {
          free(sent_part);
        }
        if (sent_c2n != (REF_GLOB *)0x0) {
          free(sent_c2n);
        }
        if (_size_per != (undefined4 *)0x0) {
          free(_size_per);
        }
        if (start_to_send != (REF_INT *)0x0) {
          free(start_to_send);
        }
        for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
          ref_private_macro_code_rss_6 =
               ref_mpi_scatter_send((REF_MPI)ncell_read,&local_60,1,1,ncell_keep);
          if (ref_private_macro_code_rss_6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x4f0,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_private_macro_code_rss_6,"send")
            ;
            return ref_private_macro_code_rss_6;
          }
          ref_private_macro_code_rss_6 = 0;
        }
      }
      else {
        do {
          read_toc = clock();
          ref_malloc_init_i_1 =
               ref_mpi_scatter_recv((REF_MPI)ncell_read,(void *)((long)&c2n + 4),1,1);
          if (ref_malloc_init_i_1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x4f6,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_malloc_init_i_1,"recv");
            return ref_malloc_init_i_1;
          }
          cVar2 = clock();
          add_toc = (cVar2 - read_toc) + add_toc;
          if (0 < c2n._4_4_) {
            read_toc = clock();
            ref_private_macro_code_rss_7 =
                 ref_mpi_scatter_recv((REF_MPI)ncell_read,dest,cell * c2n._4_4_,2);
            if (ref_private_macro_code_rss_7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x4fc,"ref_part_bin_ugrid_cell",(ulong)(uint)ref_private_macro_code_rss_7,
                     "send");
              return ref_private_macro_code_rss_7;
            }
            cVar2 = clock();
            add_toc = (cVar2 - read_toc) + add_toc;
            read_toc = clock();
            if (cell * c2n._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x501,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT negative");
              return 1;
            }
            elements_to_send = (REF_INT *)malloc((long)(cell * c2n._4_4_) << 2);
            if (elements_to_send == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x501,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_8 = 0; ref_private_macro_code_rss_8 < cell * c2n._4_4_;
                ref_private_macro_code_rss_8 = ref_private_macro_code_rss_8 + 1) {
              elements_to_send[ref_private_macro_code_rss_8] = -1;
            }
            for (node = 0; node < c2n._4_4_; node = node + 1) {
              for (new_location = 0; new_location < section_size; new_location = new_location + 1) {
                if (*(long *)(dest + (long)(new_location + cell * node) * 2) /
                    (((long)file_local + (long)*(int *)ncell_read + -1) / (long)*(int *)ncell_read)
                    < (long)file_local -
                      (long)*(int *)ncell_read *
                      ((long)(file_local[-1]._unused2 + 0x13) / (long)*(int *)ncell_read)) {
                  local_1e8 = (int)(*(long *)(dest + (long)(new_location + cell * node) * 2) /
                                   (((long)file_local + (long)*(int *)ncell_read + -1) /
                                   (long)*(int *)ncell_read));
                }
                else {
                  local_1e8 = (int)((*(long *)(dest + (long)(new_location + cell * node) * 2) -
                                    ((long)file_local -
                                    (long)*(int *)ncell_read *
                                    ((long)(file_local[-1]._unused2 + 0x13) /
                                    (long)*(int *)ncell_read)) *
                                    (((long)file_local + (long)*(int *)ncell_read + -1) /
                                    (long)*(int *)ncell_read)) /
                                   ((long)(file_local[-1]._unused2 + 0x13) /
                                   (long)*(int *)ncell_read)) +
                              ((int)file_local -
                              *(int *)ncell_read *
                              (int)((long)(file_local[-1]._unused2 + 0x13) /
                                   (long)*(int *)ncell_read));
                }
                elements_to_send[new_location + cell * node] = local_1e8;
              }
            }
            total = ref_cell_add_many_global
                              ((REF_CELL)ncell_local,(REF_NODE)nnode_local,c2n._4_4_,
                               (REF_GLOB *)dest,elements_to_send,*(REF_INT *)(ncell_read + 4));
            if (total != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x50a,"ref_part_bin_ugrid_cell",(ulong)(uint)total,"glob");
              return total;
            }
            if (elements_to_send != (REF_INT *)0x0) {
              free(elements_to_send);
            }
            cVar2 = clock();
            _ref_private_macro_code_rss_1 = (cVar2 - read_toc) + _ref_private_macro_code_rss_1;
          }
        } while (c2n._4_4_ != local_60);
      }
      free(dest);
      if (1 < *(int *)(ncell_read + 0x30)) {
        ref_mpi_stopwatch_stop((REF_MPI)ncell_read,"ugrid cell read");
      }
      total_mpi = ref_migrate_shufflin_cell((REF_NODE)nnode_local,(REF_CELL)ncell_local);
      if (total_mpi == 0) {
        if (1 < *(int *)(ncell_read + 0x30)) {
          ref_mpi_stopwatch_stop((REF_MPI)ncell_read,"ugrid cell shuffle");
        }
        if (1 < *(int *)(ncell_read + 0x30)) {
          total_add = (REF_INT)add_toc;
          uVar1 = ref_mpi_sum((REF_MPI)ncell_read,&total_add,&ref_private_macro_code_rss_9,1,1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x51c,"ref_part_bin_ugrid_cell",(ulong)uVar1,"sum");
            return uVar1;
          }
          total_add = (REF_INT)_ref_private_macro_code_rss_1;
          uVar1 = ref_mpi_sum((REF_MPI)ncell_read,&total_add,&ref_private_macro_code_rss_10,1,1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x51e,"ref_part_bin_ugrid_cell",(ulong)uVar1,"sum");
            return uVar1;
          }
          if (*(int *)(ncell_read + 4) == 0) {
            printf(" read %f mpi %f add %f\n",(double)mpi_toc / 1000000.0,
                   ((double)ref_private_macro_code_rss_9 / 1000000.0) / (double)*(int *)ncell_read,
                   ((double)ref_private_macro_code_rss_10 / 1000000.0) / (double)*(int *)ncell_read)
            ;
          }
        }
        ref_cell_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x515,"ref_part_bin_ugrid_cell",(ulong)(uint)total_mpi,"fill ghosts");
        ref_cell_local._4_4_ = total_mpi;
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_cell(
    REF_CELL ref_cell, REF_LONG ncell, REF_NODE ref_node, REF_GLOB nnode,
    FILE *file, REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset,
    REF_BOOL swap_endian, REF_BOOL sixty_four_bit) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  clock_t tic;
  clock_t read_toc = 0;
  clock_t mpi_toc = 0;
  clock_t add_toc = 0;

  chunk = MAX(1000000, (REF_INT)(ncell / ref_mpi_n(ref_mpi)));

  if (1 < ref_mpi_timing(ref_mpi) && ref_mpi_once(ref_mpi))
    printf("chunk %d ncell %ld nproc %d\n", chunk, ncell, ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = (REF_INT)MIN((REF_LONG)chunk, ncell - ncell_read);

      tic = clock();
      RSS(ref_part_bin_ugrid_pack_cell(file, swap_endian, sixty_four_bit,
                                       conn_offset, faceid_offset, section_size,
                                       ncell_read, node_per, size_per, c2n),
          "read c2n");
      read_toc += (clock() - tic);
      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }
      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      tic = clock();
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
      mpi_toc += (clock() - tic);
      /* rank 0 keepers */

      tic = clock();
      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }
      add_toc += (clock() - tic);
    }

    ref_free(dest);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      tic = clock();
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      mpi_toc += (clock() - tic);
      if (elements_to_receive > 0) {
        tic = clock();
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");
        mpi_toc += (clock() - tic);

        tic = clock();
        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);
        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
        add_toc += (clock() - tic);
      }
    } while (elements_to_receive != end_of_message);
  }
  free(sent_c2n);

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell read");
  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell shuffle");

  if (1 < ref_mpi_timing(ref_mpi)) {
    REF_INT total, total_mpi, total_add;
    total = (REF_INT)mpi_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_mpi, 1, REF_INT_TYPE), "sum");
    total = (REF_INT)add_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_add, 1, REF_INT_TYPE), "sum");
    if (ref_mpi_once(ref_mpi))
      printf(" read %f mpi %f add %f\n",
             ((REF_DBL)read_toc) / ((REF_DBL)CLOCKS_PER_SEC),
             ((REF_DBL)total_mpi) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)),
             ((REF_DBL)total_add) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)));
  }

  return REF_SUCCESS;
}